

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocmat.h
# Opt level: O3

void __thiscall TPZPostProcVar::~TPZPostProcVar(TPZPostProcVar *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZPostProcVar_0197e398;
  pcVar2 = (this->fName)._M_dataplus._M_p;
  paVar1 = &(this->fName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

~TPZPostProcVar(){}